

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void add_name(char *name)

{
  UT_hash_bucket *pUVar1;
  UT_hash_handle *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  uint uVar6;
  lookup_t *plVar7;
  size_t sVar8;
  byte *__dest;
  UT_hash_table *pUVar9;
  UT_hash_bucket *pUVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  UT_hash_handle *pUVar17;
  lookup_t *plVar18;
  uchar *_hj_key;
  
  plVar7 = (lookup_t *)malloc(0x40);
  if (plVar7 == (lookup_t *)0x0) {
    add_name_cold_2();
  }
  else {
    sVar8 = strlen(name);
    __dest = (byte *)malloc(sVar8 * 8 + 8);
    plVar7->name = (char *)__dest;
    if (__dest != (byte *)0x0) {
      strncpy((char *)__dest,name,sVar8 + 1);
      pUVar17 = &plVar7->hh;
      (plVar7->hh).next = (void *)0x0;
      (plVar7->hh).key = __dest;
      sVar8 = strlen((char *)__dest);
      (plVar7->hh).keylen = (uint)sVar8;
      plVar18 = lookup;
      if (lookup == (lookup_t *)0x0) {
        lookup = plVar7;
        (plVar7->hh).prev = (void *)0x0;
        pUVar9 = (UT_hash_table *)calloc(1,0x40);
        (plVar7->hh).tbl = pUVar9;
        if (pUVar9 == (UT_hash_table *)0x0) goto LAB_00103640;
        pUVar9->tail = pUVar17;
        pUVar9->num_buckets = 0x20;
        pUVar9->log2_num_buckets = 5;
        pUVar9->hho = 8;
        pUVar10 = (UT_hash_bucket *)calloc(1,0x200);
        pUVar9->buckets = pUVar10;
        if (pUVar10 == (UT_hash_bucket *)0x0) goto LAB_00103640;
        pUVar9->signature = 0xa0111fe1;
        plVar18 = plVar7;
      }
      else {
        pUVar9 = (lookup->hh).tbl;
        pUVar2 = pUVar9->tail;
        pUVar2->next = plVar7;
        (plVar7->hh).prev = (void *)((long)pUVar2 - pUVar9->hho);
        pUVar9->tail = pUVar17;
      }
      uVar12 = pUVar9->num_items + 1;
      pUVar9->num_items = uVar12;
      (plVar7->hh).tbl = pUVar9;
      sVar8 = strlen((char *)__dest);
      uVar6 = (uint)sVar8;
      if (uVar6 < 0xc) {
        uVar13 = 0x9e3779b9;
        uVar11 = 0xfeedbeef;
        uVar14 = 0x9e3779b9;
        uVar16 = uVar6;
      }
      else {
        uVar14 = 0x9e3779b9;
        uVar11 = 0xfeedbeef;
        uVar13 = 0x9e3779b9;
        uVar15 = sVar8 & 0xffffffff;
        do {
          uVar11 = uVar11 + *(int *)(__dest + 8);
          uVar16 = uVar11 >> 0xd ^
                   ((uVar14 + *(int *)__dest) - (uVar13 + *(int *)(__dest + 4))) - uVar11;
          uVar13 = uVar16 << 8 ^ ((uVar13 + *(int *)(__dest + 4)) - uVar11) - uVar16;
          uVar11 = uVar13 >> 0xd ^ (uVar11 - uVar16) - uVar13;
          uVar16 = uVar11 >> 0xc ^ (uVar16 - uVar13) - uVar11;
          uVar13 = uVar16 << 0x10 ^ (uVar13 - uVar11) - uVar16;
          uVar11 = uVar13 >> 5 ^ (uVar11 - uVar16) - uVar13;
          uVar14 = uVar11 >> 3 ^ (uVar16 - uVar13) - uVar11;
          uVar13 = uVar14 << 10 ^ (uVar13 - uVar11) - uVar14;
          uVar11 = uVar13 >> 0xf ^ (uVar11 - uVar14) - uVar13;
          __dest = __dest + 0xc;
          uVar16 = (int)uVar15 - 0xc;
          uVar15 = (ulong)uVar16;
        } while (0xb < uVar16);
      }
      uVar11 = uVar11 + uVar6;
      (plVar7->hh).hashv = uVar11;
      switch(uVar16) {
      case 0xb:
        uVar11 = (uint)__dest[10] * 0x1000000 + uVar11;
        (plVar7->hh).hashv = uVar11;
      case 10:
        uVar11 = (uint)__dest[9] * 0x10000 + uVar11;
        (plVar7->hh).hashv = uVar11;
      case 9:
        uVar11 = (uint)__dest[8] * 0x100 + uVar11;
        (plVar7->hh).hashv = uVar11;
      case 8:
        uVar13 = (uint)__dest[7] * 0x1000000 + uVar13;
      case 7:
        uVar13 = (uint)__dest[6] * 0x10000 + uVar13;
      case 6:
        uVar13 = (uint)__dest[5] * 0x100 + uVar13;
      case 5:
        uVar13 = __dest[4] + uVar13;
      case 4:
        uVar14 = (uint)__dest[3] * 0x1000000 + uVar14;
      case 3:
        uVar14 = (uint)__dest[2] * 0x10000 + uVar14;
      case 2:
        uVar14 = (uint)__dest[1] * 0x100 + uVar14;
      case 1:
        uVar14 = *__dest + uVar14;
      }
      uVar6 = uVar11 >> 0xd ^ (uVar14 - uVar13) - uVar11;
      uVar13 = uVar6 << 8 ^ (uVar13 - uVar11) - uVar6;
      uVar11 = uVar13 >> 0xd ^ (uVar11 - uVar6) - uVar13;
      uVar16 = uVar11 >> 0xc ^ (uVar6 - uVar13) - uVar11;
      uVar6 = uVar16 << 0x10 ^ (uVar13 - uVar11) - uVar16;
      uVar11 = uVar6 >> 5 ^ (uVar11 - uVar16) - uVar6;
      uVar16 = uVar11 >> 3 ^ (uVar16 - uVar6) - uVar11;
      uVar6 = uVar16 << 10 ^ (uVar6 - uVar11) - uVar16;
      uVar6 = uVar6 >> 0xf ^ uVar11 - (uVar16 + uVar6);
      (plVar7->hh).hashv = uVar6;
      pUVar3 = (plVar18->hh).tbl;
      uVar6 = pUVar3->num_buckets - 1 & uVar6;
      pUVar10 = pUVar3->buckets;
      pUVar10[uVar6].count = pUVar10[uVar6].count + 1;
      pUVar2 = pUVar10[uVar6].hh_head;
      (plVar7->hh).hh_next = pUVar2;
      (plVar7->hh).hh_prev = (UT_hash_handle *)0x0;
      if (pUVar2 != (UT_hash_handle *)0x0) {
        pUVar2->hh_prev = pUVar17;
      }
      pUVar10[uVar6].hh_head = pUVar17;
      pUVar10 = ((lookup->hh).tbl)->buckets;
      if ((pUVar10[uVar6].count < pUVar10[uVar6].expand_mult * 10 + 10) || (pUVar9->noexpand == 1))
      {
        return;
      }
      uVar6 = pUVar9->num_buckets;
      pUVar10 = (UT_hash_bucket *)calloc(1,(ulong)(uVar6 * 2) << 4);
      if (pUVar10 != (UT_hash_bucket *)0x0) {
        uVar16 = uVar6 * 2 - 1;
        uVar12 = ((uVar12 >> ((char)pUVar9->log2_num_buckets + 1U & 0x1f)) + 1) -
                 (uint)((uVar16 & uVar12) == 0);
        pUVar9->ideal_chain_maxlen = uVar12;
        pUVar9->nonideal_items = 0;
        __ptr = pUVar9->buckets;
        if ((ulong)uVar6 != 0) {
          uVar11 = 0;
          uVar15 = 0;
          do {
            pUVar2 = __ptr[uVar15].hh_head;
            while (pUVar2 != (UT_hash_handle *)0x0) {
              pUVar4 = pUVar2->hh_next;
              uVar14 = pUVar2->hashv & uVar16;
              pUVar1 = pUVar10 + uVar14;
              uVar13 = pUVar10[uVar14].count + 1;
              pUVar10[uVar14].count = uVar13;
              if (uVar12 < uVar13) {
                uVar11 = uVar11 + 1;
                pUVar9->nonideal_items = uVar11;
                pUVar1->expand_mult = uVar13 / uVar12;
              }
              pUVar2->hh_prev = (UT_hash_handle *)0x0;
              pUVar5 = pUVar1->hh_head;
              pUVar2->hh_next = pUVar5;
              if (pUVar5 != (UT_hash_handle *)0x0) {
                pUVar5->hh_prev = pUVar2;
              }
              pUVar1->hh_head = pUVar2;
              pUVar2 = pUVar4;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar6);
        }
        free(__ptr);
        pUVar9 = pUVar17->tbl;
        pUVar9->num_buckets = pUVar9->num_buckets << 1;
        pUVar9->log2_num_buckets = pUVar9->log2_num_buckets + 1;
        pUVar9->buckets = pUVar10;
        if (pUVar9->num_items >> 1 < pUVar9->nonideal_items) {
          uVar6 = pUVar9->ineff_expands + 1;
          pUVar9->ineff_expands = uVar6;
          if (uVar6 < 2) {
            return;
          }
          pUVar9->noexpand = 1;
          return;
        }
        pUVar9->ineff_expands = 0;
        return;
      }
      goto LAB_00103640;
    }
  }
  add_name_cold_1();
LAB_00103640:
  exit(-1);
}

Assistant:

void add_name(char *name)
{
	lookup_t *s;
	s = (lookup_t *)malloc(sizeof(lookup_t));
	if (s == NULL) {
		fprintf(stderr,"couldn't get memory for lookup_t\n");
		exit(EXIT_FAILURE);
	} else {
		s->name = NULL;
	}
	s->name = (char *)malloc(sizeof(char *) * (strlen(name)+1));
	if (s->name == NULL) {
		fprintf(stderr,"couldn't get memory for name string\n");
		exit(EXIT_FAILURE);
	}
	strncpy(s->name,name,strlen(name)+1);

	HASH_ADD_KEYPTR( hh, lookup, s->name, strlen(s->name), s );
}